

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointTriface::IntLoadConstraint_C
          (ChLinkPointTriface *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  long lVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  undefined1 auVar13 [16];
  int iVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar30 [16];
  
  uVar15 = (ulong)off_L;
  iVar14 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar14 == '\0') {
    return;
  }
  peVar1 = (this->mtriangle).mnodeB1.
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = (this->mtriangle).mnodeB2.
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar17 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
  dVar7 = *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20 - dVar17;
  dVar8 = *(double *)&peVar2->field_0x28 - *(double *)&peVar1->field_0x28;
  dVar28 = *(double *)&peVar2->field_0x30 - *(double *)&peVar1->field_0x30;
  peVar2 = (this->mtriangle).mnodeB3.
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar17 = *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20 - dVar17;
  dVar9 = *(double *)&peVar2->field_0x28 - *(double *)&peVar1->field_0x28;
  dVar22 = *(double *)&peVar2->field_0x30 - *(double *)&peVar1->field_0x30;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar8;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar22;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar9 * dVar28;
  auVar16 = vfmsub231sd_fma(auVar31,auVar16,auVar29);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar17;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar28;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar22 * dVar7;
  auVar18 = vfmsub231sd_fma(auVar30,auVar23,auVar26);
  dVar28 = auVar18._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar7;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar9;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar17 * dVar8;
  auVar23 = vfmsub231sd_fma(auVar27,auVar18,auVar25);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar28 * dVar28;
  auVar18 = vfmadd231sd_fma(auVar19,auVar16,auVar16);
  auVar18 = vfmadd231sd_fma(auVar18,auVar23,auVar23);
  if (auVar18._0_8_ < 0.0) {
    dVar17 = sqrt(auVar18._0_8_);
  }
  else {
    auVar18 = vsqrtsd_avx(auVar18,auVar18);
    dVar17 = auVar18._0_8_;
  }
  bVar12 = 2.2250738585072014e-308 <= dVar17;
  dVar17 = 1.0 / dVar17;
  dVar7 = this->s2;
  dVar8 = this->s3;
  dVar10 = (1.0 - dVar7) - dVar8;
  peVar1 = (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (this->mtriangle).mnodeB1.
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3 = (this->mtriangle).mnodeB2.
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (this->mtriangle).mnodeB3.
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar9 = this->d;
  dVar22 = ((((*(double *)&(peVar1->super_ChNodeFEAbase).field_0x20 -
              dVar10 * *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20) -
             dVar7 * *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20) -
            dVar8 * *(double *)&(peVar4->super_ChNodeFEAbase).field_0x20) -
           (double)((ulong)bVar12 * (long)(dVar17 * auVar16._0_8_) +
                   (ulong)!bVar12 * 0x3ff0000000000000) * dVar9) * c;
  dVar28 = ((((*(double *)&peVar1->field_0x28 - dVar10 * *(double *)&peVar2->field_0x28) -
             dVar7 * *(double *)&peVar3->field_0x28) - dVar8 * *(double *)&peVar4->field_0x28) -
           (double)((ulong)bVar12 * (long)(dVar17 * dVar28)) * dVar9) * c;
  dVar17 = ((((*(double *)&peVar1->field_0x30 - dVar10 * *(double *)&peVar2->field_0x30) -
             dVar7 * *(double *)&peVar3->field_0x30) - dVar8 * *(double *)&peVar4->field_0x30) -
           (double)((ulong)bVar12 * (long)(auVar23._0_8_ * dVar17)) * dVar9) * c;
  if (do_clamp) {
    auVar13._8_8_ = in_XMM1_Qb;
    auVar13._0_8_ = recovery_clamp;
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    auVar16 = vxorpd_avx512vl(auVar13,auVar11);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar22;
    auVar18 = vmaxsd_avx(auVar24,auVar16);
    auVar18 = vminsd_avx(auVar18,auVar13);
    dVar22 = auVar18._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar28;
    auVar18 = vmaxsd_avx(auVar21,auVar16);
    auVar18 = vminsd_avx(auVar18,auVar13);
    dVar28 = auVar18._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar17;
    auVar18 = vmaxsd_avx(auVar20,auVar16);
    auVar18 = vminsd_avx(auVar18,auVar13);
    dVar17 = auVar18._0_8_;
  }
  lVar5 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar15 < lVar5) {
    pdVar6 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar6[uVar15] = dVar22 + pdVar6[uVar15];
    uVar15 = (ulong)(off_L + 1);
    if ((long)uVar15 < lVar5) {
      pdVar6[uVar15] = dVar28 + pdVar6[uVar15];
      uVar15 = (ulong)(off_L + 2);
      if ((long)uVar15 < lVar5) {
        pdVar6[uVar15] = dVar17 + pdVar6[uVar15];
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkPointTriface::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                             ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                             const double c,            // a scaling factor
                                             bool do_clamp,             // apply clamping to c*C?
                                             double recovery_clamp      // value for min/max clamping of c*C
) {
    if (!IsActive())
        return;

    // Compute residual of constraint as distance of two points: one is A,
    // other is on triangle at the s2,s3 area coordinates:
    //  C = A - s1*B1 - s2*B2 - s3*B3
    // If an offset d is desired, along normal N, this becomes:
    //  C = A - s1*B1 - s2*B2 - s3*B3 - d*N

    ChVector<> N =
        Vcross(mtriangle.mnodeB2->pos - mtriangle.mnodeB1->pos, mtriangle.mnodeB3->pos - mtriangle.mnodeB1->pos);
    N.Normalize();
    double s1 = 1 - s2 - s3;

    ChVector<> res = mnodeA->GetPos() - s1 * mtriangle.mnodeB1->pos - s2 * mtriangle.mnodeB2->pos -
                     s3 * mtriangle.mnodeB3->pos - N * d;

    ChVector<> cres = res * c;

    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cres.x();
    Qc(off_L + 1) += cres.y();
    Qc(off_L + 2) += cres.z();
}